

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

double gauss_newton(double *rgb,double *coeffs,int it)

{
  undefined1 auVar1 [16];
  int j;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *this;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *J [3];
  double x [3];
  double residual [3];
  int P [4];
  double J2 [3];
  double J1 [3];
  double J0 [3];
  double *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  double local_d8 [4];
  double local_b8 [4];
  int local_98 [4];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  double local_48 [3];
  
  auVar6 = SUB6416(ZEXT864(0),0) << 0x40;
  if (0 < it) {
    iVar5 = 0;
    do {
      local_f8 = local_48;
      local_f0 = local_68;
      local_e8 = local_88;
      eval_residual(coeffs,rgb,local_b8);
      eval_jacobian(coeffs,rgb,&local_f8);
      iVar2 = LUPDecompose(&local_f8,3,1e-15,local_98);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RGB ",4);
        poVar4 = std::ostream::_M_insert<double>(*rgb);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>(rgb[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>(rgb[2]);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> ",3);
        poVar4 = std::ostream::_M_insert<double>(*coeffs);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>(coeffs[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>(coeffs[2]);
        std::endl<char,std::char_traits<char>>(poVar4);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"LU decomposition failed!");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      LUPSolve(&local_f8,local_98,local_b8,3,local_d8);
      auVar7 = ZEXT864(0) << 0x40;
      lVar3 = 0;
      do {
        coeffs[lVar3] = coeffs[lVar3] - local_d8[lVar3];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_b8[lVar3];
        auVar6 = vfmadd231sd_fma(auVar7._0_16_,auVar6,auVar6);
        auVar7 = ZEXT1664(auVar6);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = coeffs[1];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = coeffs[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *coeffs;
      auVar1 = vmaxsd_avx(auVar9,auVar1);
      auVar1 = vmaxsd_avx(auVar10,auVar1);
      if (200.0 < auVar1._0_8_) {
        dVar8 = 200.0 / auVar1._0_8_;
        *coeffs = dVar8 * *coeffs;
        coeffs[1] = dVar8 * coeffs[1];
        coeffs[2] = dVar8 * coeffs[2];
        coeffs[3] = coeffs[3];
      }
    } while ((1e-06 <= auVar6._0_8_) && (iVar5 = iVar5 + 1, iVar5 != it));
  }
  if (auVar6._0_8_ < 0.0) {
    dVar8 = sqrt(auVar6._0_8_);
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar8 = auVar6._0_8_;
  }
  return dVar8;
}

Assistant:

double gauss_newton(const double rgb[3], double coeffs[3], int it = 15) {
    double r = 0;
    for (int i = 0; i < it; ++i) {
        double J0[3], J1[3], J2[3], *J[3] = {J0, J1, J2};

        double residual[3];

        eval_residual(coeffs, rgb, residual);
        eval_jacobian(coeffs, rgb, J);

        int P[4];
        int rv = LUPDecompose(J, 3, 1e-15, P);
        if (rv != 1) {
            std::cout << "RGB " << rgb[0] << " " << rgb[1] << " " << rgb[2] << std::endl;
            std::cout << "-> " << coeffs[0] << " " << coeffs[1] << " " << coeffs[2]
                      << std::endl;
            throw std::runtime_error("LU decomposition failed!");
        }

        double x[3];
        LUPSolve(J, P, residual, 3, x);

        r = 0.0;
        for (int j = 0; j < 3; ++j) {
            coeffs[j] -= x[j];
            r += residual[j] * residual[j];
        }
        double max = std::max(std::max(coeffs[0], coeffs[1]), coeffs[2]);

        if (max > 200) {
            for (int j = 0; j < 3; ++j)
                coeffs[j] *= 200 / max;
        }

        if (r < 1e-6)
            break;
    }
    return std::sqrt(r);
}